

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::CastInst>::run(TypedDeleter<LLVMBC::CastInst> *this)

{
  TypedDeleter<LLVMBC::CastInst> *this_local;
  
  CastInst::~CastInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}